

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# anim_animators.cpp
# Opt level: O0

Am_Value_List break_up_objects(Am_Object *interp,Am_Object *orig,bool vis)

{
  bool bVar1;
  unsigned_short uVar2;
  int iVar3;
  Am_Value *pAVar4;
  Am_Wrapper *value;
  Am_Object *pAVar5;
  Am_Method_Wrapper *pAVar6;
  Am_Constraint *pAVar7;
  byte in_CL;
  undefined7 in_register_00000011;
  Am_List_Item *extraout_RDX;
  Am_List_Item *extraout_RDX_00;
  Am_List_Item *pAVar8;
  double dVar9;
  double dVar10;
  Am_Value_List AVar11;
  Am_Object local_b8;
  Am_Object local_b0;
  Am_Object local_a8;
  double local_a0;
  double rads;
  double rads_per_obj;
  int top;
  int left;
  int y;
  int x;
  int maxwh;
  int win_center_y;
  int win_center_x;
  int win_h;
  int win_w;
  int trans_top;
  int trans_left;
  int num_parts;
  Am_Object animator;
  Am_Object from_part;
  Am_Object part;
  Am_Object win;
  int local_2c;
  int local_28;
  int maxobjh;
  int maxobjw;
  bool vis_local;
  Am_Object *orig_local;
  Am_Object *interp_local;
  Am_Value_List *new_parts;
  
  _maxobjw = (Am_Object *)CONCAT71(in_register_00000011,vis);
  maxobjh._3_1_ = in_CL & 1;
  maxobjh._2_1_ = 0;
  orig_local = orig;
  interp_local = interp;
  Am_Value_List::Am_Value_List((Am_Value_List *)interp);
  local_28 = 0;
  local_2c = 0;
  add_obj_and_parts(_maxobjw,(Am_Value_List *)interp,&local_28,&local_2c);
  pAVar4 = Am_Object::Get(_maxobjw,0x68,0);
  Am_Object::Am_Object(&part,pAVar4);
  Am_Object::Am_Object(&from_part);
  Am_Object::Am_Object(&animator);
  Am_Object::Am_Object((Am_Object *)&trans_left);
  uVar2 = Am_Value_List::Length((Am_Value_List *)interp);
  trans_top = (int)uVar2;
  pAVar4 = Am_Object::Get(&part,0x66,0);
  win_center_x = Am_Value::operator_cast_to_int(pAVar4);
  pAVar4 = Am_Object::Get(&part,0x67,0);
  win_center_y = Am_Value::operator_cast_to_int(pAVar4);
  maxwh = win_center_x / 2;
  x = win_center_y / 2;
  iVar3 = imax(win_center_x + local_28,win_center_y + local_2c);
  y = iVar3 / 2 + 1;
  rads = 6.283185307179586 / (double)trans_top;
  local_a0 = 0.0;
  Am_Value_List::Start((Am_Value_List *)interp);
  while( true ) {
    bVar1 = Am_Value_List::Last((Am_Value_List *)interp);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    pAVar4 = Am_Value_List::Get((Am_Value_List *)interp);
    Am_Object::operator=(&from_part,pAVar4);
    Am_Object::Remove_From_Owner(&from_part);
    pAVar4 = Am_Object::Get(&from_part,0xc,0);
    Am_Object::operator=(&animator,pAVar4);
    Am_Translate_Coordinates(&animator,0,0,&part,&win_w,&win_h);
    dVar9 = (double)y;
    dVar10 = sin(local_a0);
    left = (int)(dVar9 * dVar10);
    dVar9 = (double)y;
    dVar10 = cos(local_a0);
    top = (int)(dVar9 * dVar10);
    rads_per_obj._4_4_ = maxwh + left;
    rads_per_obj._0_4_ = x - top;
    Am_Object::Create(&local_a8,(char *)&Am_Animator);
    Am_Object::operator=((Am_Object *)&trans_left,&local_a8);
    Am_Object::~Am_Object(&local_a8);
    Am_Object::Get_Object(&local_b0,(Am_Slot_Key)&trans_left,0xc5);
    value = Am_Object::operator_cast_to_Am_Wrapper_(orig_local);
    pAVar5 = Am_Object::Set(&local_b0,0x171,value,1);
    pAVar6 = Am_Object_Method::operator_cast_to_Am_Method_Wrapper_(&fly_apart_anim_done);
    pAVar5 = Am_Object::Set(pAVar5,0xca,pAVar6,0);
    pAVar6 = Am_Object_Method::operator_cast_to_Am_Method_Wrapper_(&fly_apart_anim_done);
    Am_Object::Set(pAVar5,0xc9,pAVar6,0);
    Am_Object::~Am_Object(&local_b0);
    if ((maxobjh._3_1_ & 1) == 0) {
      Am_Object::Set(&from_part,100,win_w,0);
      Am_Object::Set(&from_part,0x65,win_h,0);
    }
    else {
      Am_Object::Set(&from_part,100,rads_per_obj._4_4_,0);
      Am_Object::Set(&from_part,0x65,rads_per_obj._0_4_,0);
    }
    Am_Object::Am_Object(&local_b8,&from_part);
    Am_Object::Add_Part(&part,&local_b8,true,0);
    Am_Object::~Am_Object(&local_b8);
    pAVar7 = Am_Animate_With((Am_Object *)&trans_left);
    Am_Object::Set(&from_part,100,pAVar7,0);
    pAVar7 = Am_Animate_With((Am_Object *)&trans_left);
    Am_Object::Set(&from_part,0x65,pAVar7,0);
    if ((maxobjh._3_1_ & 1) == 0) {
      Am_Object::Set(&from_part,100,rads_per_obj._4_4_,0);
      Am_Object::Set(&from_part,0x65,rads_per_obj._0_4_,0);
    }
    else {
      Am_Object::Set(&from_part,100,win_w,0);
      Am_Object::Set(&from_part,0x65,win_h,0);
    }
    Am_Value_List::Next((Am_Value_List *)interp);
    local_a0 = rads + local_a0;
  }
  maxobjh._2_1_ = 1;
  Am_Object::~Am_Object((Am_Object *)&trans_left);
  Am_Object::~Am_Object(&animator);
  Am_Object::~Am_Object(&from_part);
  Am_Object::~Am_Object(&part);
  pAVar8 = extraout_RDX;
  if ((maxobjh._2_1_ & 1) == 0) {
    Am_Value_List::~Am_Value_List((Am_Value_List *)interp);
    pAVar8 = extraout_RDX_00;
  }
  AVar11.item = pAVar8;
  AVar11.data = (Am_Value_List_Data *)interp;
  return AVar11;
}

Assistant:

Am_Value_List
break_up_objects(Am_Object &interp, Am_Object &orig, bool vis)
{
  Am_Value_List new_parts;
  int maxobjw = 0;
  int maxobjh = 0;
  //get flat list of all parts
  add_obj_and_parts(orig, new_parts, maxobjw, maxobjh);
  Am_INTER_TRACE_PRINT(interp, "  New parts = " << new_parts);
  Am_Object win = orig.Get(Am_WINDOW);
  Am_Object part, from_part, animator;
  int num_parts = new_parts.Length();
  int trans_left, trans_top, win_w, win_h, win_center_x, win_center_y, maxwh, x,
      y, left, top;
  win_w = win.Get(Am_WIDTH);
  win_h = win.Get(Am_HEIGHT);
  win_center_x = win_w / 2;
  win_center_y = win_h / 2;
  maxwh = imax(win_w + maxobjw, win_h + maxobjh) / 2 + 1;
  double rads_per_obj = (M_PI * 2) / num_parts;
  double rads = 0.0;
  for (new_parts.Start(); !new_parts.Last();
       new_parts.Next(), rads += rads_per_obj) {
    part = new_parts.Get();
    part.Remove_From_Owner(); //make sure not a part now
    from_part = part.Get(Am_SOURCE_OF_COPY);
    Am_Translate_Coordinates(from_part, 0, 0, win, trans_left, trans_top);
    x = (int)(maxwh * sin(rads));
    y = (int)(maxwh * cos(rads));
    left = win_center_x + x;
    top = win_center_y - y;
    animator = Am_Animator.Create();
    animator.Get_Object(Am_COMMAND)
        .Set(Am_SAVED_OLD_OBJECT_OWNER, interp, Am_OK_IF_NOT_THERE)
        .Set(Am_DO_METHOD, fly_apart_anim_done)
        .Set(Am_ABORT_DO_METHOD, fly_apart_anim_done);
    //set start location
    if (vis) { // then starts off edge
      part.Set(Am_LEFT, left);
      part.Set(Am_TOP, top);
    } else { //starts at object
      part.Set(Am_LEFT, trans_left);
      part.Set(Am_TOP, trans_top);
    }
    win.Add_Part(part);

    part.Set(Am_LEFT, Am_Animate_With(animator));
    part.Set(Am_TOP, Am_Animate_With(animator));
    if (vis) { //then goes to object
      part.Set(Am_LEFT, trans_left);
      part.Set(Am_TOP, trans_top);
    } else { // goes off edge
      part.Set(Am_LEFT, left);
      part.Set(Am_TOP, top);
    }
  }
  return new_parts;
}